

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O2

VRInputDevice * __thiscall
MinVR::VRSpecificItemFactory<MinVR::VRInputDevice>::create
          (VRSpecificItemFactory<MinVR::VRInputDevice> *this,VRMainInterface *vrMain,
          VRDataIndex *config,string *dataContainer)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  string type;
  string attributeName;
  string sStack_68;
  string local_48;
  VRInputDevice *pVVar3;
  
  VRInputDevice::getAttributeName_abi_cxx11_();
  VRDataIndex::getAttributeValue(&sStack_68,config,dataContainer,&local_48);
  bVar1 = std::operator!=(&sStack_68,&this->_typeName);
  if (bVar1) {
    pVVar3 = (VRInputDevice *)0x0;
  }
  else {
    iVar2 = (*(this->super_VRItemFactory)._vptr_VRItemFactory[4])(this,vrMain,config,dataContainer);
    pVVar3 = (VRInputDevice *)CONCAT44(extraout_var,iVar2);
  }
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return pVVar3;
}

Assistant:

virtual T* create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &dataContainer) {
		std::string attributeName = T::getAttributeName();

		std::string type = config->getAttributeValue(dataContainer, attributeName);

		if (type != _typeName) {
			// This factory cannot create the type specified
			return NULL;
		}

		return createConcrete(vrMain, config, dataContainer);
	}